

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchriter.cpp
# Opt level: O1

UChar32 __thiscall icu_63::UCharCharacterIterator::previous32(UCharCharacterIterator *this)

{
  char16_t cVar1;
  char16_t cVar2;
  int iVar3;
  int iVar4;
  char16_t *pcVar5;
  uint uVar6;
  
  iVar3 = (this->super_CharacterIterator).pos;
  iVar4 = (this->super_CharacterIterator).begin;
  uVar6 = 0xffff;
  if (iVar4 < iVar3) {
    pcVar5 = this->text;
    (this->super_CharacterIterator).pos = iVar3 + -1;
    cVar1 = pcVar5[(long)iVar3 + -1];
    uVar6 = (uint)(ushort)cVar1;
    if (((iVar4 < iVar3 + -1) && (((ushort)cVar1 & 0xfc00) == 0xdc00)) &&
       (cVar2 = pcVar5[(long)iVar3 + -2], (cVar2 & 0xfc00U) == 0xd800)) {
      (this->super_CharacterIterator).pos = iVar3 + -2;
      uVar6 = (uint)(ushort)cVar1 + (uint)(ushort)cVar2 * 0x400 + 0xfca02400;
    }
  }
  return uVar6;
}

Assistant:

UChar32
UCharCharacterIterator::previous32() {
    if (pos > begin) {
        UChar32 c;
        U16_PREV(text, begin, pos, c);
        return c;
    } else {
        return DONE;
    }
}